

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::DragBehavior(ImGuiID id,ImGuiDataType data_type,void *v,float v_speed,void *v_min,
                        void *v_max,char *format,float power,ImGuiDragFlags flags)

{
  double local_1a8;
  double local_198;
  float local_178;
  float local_170;
  unsigned_long_long local_158;
  unsigned_long_long local_148;
  longlong local_128;
  longlong local_118;
  uint local_f8;
  uint local_f0;
  int local_d8;
  int local_d0;
  ushort local_b6;
  ushort local_ae;
  short local_a6;
  short local_9e;
  byte local_95;
  byte local_8d;
  char local_85;
  char local_7d;
  uint local_6c;
  bool r_3;
  ImU32 v32_3;
  bool r_2;
  ImS32 v32_2;
  bool r_1;
  ImU32 v32_1;
  bool r;
  ImGuiContext *pIStack_50;
  ImS32 v32;
  ImGuiContext *g;
  char *pcStack_40;
  float power_local;
  char *format_local;
  void *v_max_local;
  void *v_min_local;
  double *pdStack_20;
  float v_speed_local;
  void *v_local;
  ImGuiID local_10;
  ImGuiDataType data_type_local;
  ImGuiID id_local;
  
  pIStack_50 = GImGui;
  g._4_4_ = power;
  pcStack_40 = format;
  format_local = (char *)v_max;
  v_max_local = v_min;
  v_min_local._4_4_ = v_speed;
  pdStack_20 = (double *)v;
  v_local._4_4_ = data_type;
  local_10 = id;
  if (GImGui->ActiveId == id) {
    if ((GImGui->ActiveIdSource == ImGuiInputSource_Mouse) &&
       (((GImGui->IO).MouseDown[0] & 1U) == 0)) {
      ClearActiveID();
    }
    else if ((GImGui->ActiveIdSource == ImGuiInputSource_Nav) &&
            ((GImGui->NavActivatePressedId == id && ((GImGui->ActiveIdIsJustActivated & 1U) == 0))))
    {
      ClearActiveID();
    }
  }
  if (pIStack_50->ActiveId == local_10) {
    switch(v_local._4_4_) {
    case 0:
      v32_1 = (ImU32)*(char *)pdStack_20;
      if (v_max_local == (void *)0x0) {
        local_7d = -0x80;
      }
      else {
        local_7d = *v_max_local;
      }
      if (format_local == (char *)0x0) {
        local_85 = '\x7f';
      }
      else {
        local_85 = *format_local;
      }
      data_type_local._3_1_ =
           DragBehaviorT<int,int,float>
                     (4,(int *)&v32_1,v_min_local._4_4_,(int)local_7d,(int)local_85,pcStack_40,
                      g._4_4_,flags);
      if (data_type_local._3_1_) {
        *(char *)pdStack_20 = (char)v32_1;
      }
      break;
    case 1:
      v32_2 = (ImS32)*(byte *)pdStack_20;
      if (v_max_local == (void *)0x0) {
        local_8d = 0;
      }
      else {
        local_8d = *v_max_local;
      }
      if (format_local == (char *)0x0) {
        local_95 = 0xff;
      }
      else {
        local_95 = *format_local;
      }
      data_type_local._3_1_ =
           DragBehaviorT<unsigned_int,int,float>
                     (5,(uint *)&v32_2,v_min_local._4_4_,(uint)local_8d,(uint)local_95,pcStack_40,
                      g._4_4_,flags);
      if (data_type_local._3_1_) {
        *(char *)pdStack_20 = (char)v32_2;
      }
      break;
    case 2:
      v32_3 = (ImU32)*(short *)pdStack_20;
      if (v_max_local == (void *)0x0) {
        local_9e = -0x8000;
      }
      else {
        local_9e = *v_max_local;
      }
      if (format_local == (char *)0x0) {
        local_a6 = 0x7fff;
      }
      else {
        local_a6 = *(short *)format_local;
      }
      data_type_local._3_1_ =
           DragBehaviorT<int,int,float>
                     (4,(int *)&v32_3,v_min_local._4_4_,(int)local_9e,(int)local_a6,pcStack_40,
                      g._4_4_,flags);
      if (data_type_local._3_1_) {
        *(short *)pdStack_20 = (short)v32_3;
      }
      break;
    case 3:
      local_6c = (uint)*(ushort *)pdStack_20;
      if (v_max_local == (void *)0x0) {
        local_ae = 0;
      }
      else {
        local_ae = *v_max_local;
      }
      if (format_local == (char *)0x0) {
        local_b6 = 0xffff;
      }
      else {
        local_b6 = *(ushort *)format_local;
      }
      data_type_local._3_1_ =
           DragBehaviorT<unsigned_int,int,float>
                     (5,&local_6c,v_min_local._4_4_,(uint)local_ae,(uint)local_b6,pcStack_40,g._4_4_
                      ,flags);
      if (data_type_local._3_1_) {
        *(short *)pdStack_20 = (short)local_6c;
      }
      break;
    case 4:
      if (v_max_local == (void *)0x0) {
        local_d0 = -0x80000000;
      }
      else {
        local_d0 = *v_max_local;
      }
      if (format_local == (char *)0x0) {
        local_d8 = 0x7fffffff;
      }
      else {
        local_d8 = *(int *)format_local;
      }
      data_type_local._3_1_ =
           DragBehaviorT<int,int,float>
                     (v_local._4_4_,(int *)pdStack_20,v_min_local._4_4_,local_d0,local_d8,pcStack_40
                      ,g._4_4_,flags);
      break;
    case 5:
      if (v_max_local == (void *)0x0) {
        local_f0 = 0;
      }
      else {
        local_f0 = *v_max_local;
      }
      if (format_local == (char *)0x0) {
        local_f8 = 0xffffffff;
      }
      else {
        local_f8 = *(uint *)format_local;
      }
      data_type_local._3_1_ =
           DragBehaviorT<unsigned_int,int,float>
                     (v_local._4_4_,(uint *)pdStack_20,v_min_local._4_4_,local_f0,local_f8,
                      pcStack_40,g._4_4_,flags);
      break;
    case 6:
      if (v_max_local == (void *)0x0) {
        local_118 = -0x8000000000000000;
      }
      else {
        local_118 = *v_max_local;
      }
      if (format_local == (char *)0x0) {
        local_128 = 0x7fffffffffffffff;
      }
      else {
        local_128 = *(longlong *)format_local;
      }
      data_type_local._3_1_ =
           DragBehaviorT<long_long,long_long,double>
                     (v_local._4_4_,(longlong *)pdStack_20,v_min_local._4_4_,local_118,local_128,
                      pcStack_40,g._4_4_,flags);
      break;
    case 7:
      if (v_max_local == (void *)0x0) {
        local_148 = 0;
      }
      else {
        local_148 = *v_max_local;
      }
      if (format_local == (char *)0x0) {
        local_158 = 0xffffffffffffffff;
      }
      else {
        local_158 = *(unsigned_long_long *)format_local;
      }
      data_type_local._3_1_ =
           DragBehaviorT<unsigned_long_long,long_long,double>
                     (v_local._4_4_,(unsigned_long_long *)pdStack_20,v_min_local._4_4_,local_148,
                      local_158,pcStack_40,g._4_4_,flags);
      break;
    case 8:
      if (v_max_local == (void *)0x0) {
        local_170 = -3.4028235e+38;
      }
      else {
        local_170 = *v_max_local;
      }
      if (format_local == (char *)0x0) {
        local_178 = 3.4028235e+38;
      }
      else {
        local_178 = *(float *)format_local;
      }
      data_type_local._3_1_ =
           DragBehaviorT<float,float,float>
                     (v_local._4_4_,(float *)pdStack_20,v_min_local._4_4_,local_170,local_178,
                      pcStack_40,g._4_4_,flags);
      break;
    case 9:
      if (v_max_local == (void *)0x0) {
        local_198 = -1.79769313486232e+308;
      }
      else {
        local_198 = *v_max_local;
      }
      if (format_local == (char *)0x0) {
        local_1a8 = 1.79769313486232e+308;
      }
      else {
        local_1a8 = *(double *)format_local;
      }
      data_type_local._3_1_ =
           DragBehaviorT<double,double,double>
                     (v_local._4_4_,pdStack_20,v_min_local._4_4_,local_198,local_1a8,pcStack_40,
                      g._4_4_,flags);
      break;
    case 10:
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui_widgets.cpp"
                    ,0x7eb,
                    "bool ImGui::DragBehavior(ImGuiID, ImGuiDataType, void *, float, const void *, const void *, const char *, float, ImGuiDragFlags)"
                   );
    }
  }
  else {
    data_type_local._3_1_ = false;
  }
  return data_type_local._3_1_;
}

Assistant:

bool ImGui::DragBehavior(ImGuiID id, ImGuiDataType data_type, void* v, float v_speed, const void* v_min, const void* v_max, const char* format, float power, ImGuiDragFlags flags)
{
    ImGuiContext& g = *GImGui;
    if (g.ActiveId == id)
    {
        if (g.ActiveIdSource == ImGuiInputSource_Mouse && !g.IO.MouseDown[0])
            ClearActiveID();
        else if (g.ActiveIdSource == ImGuiInputSource_Nav && g.NavActivatePressedId == id && !g.ActiveIdIsJustActivated)
            ClearActiveID();
    }
    if (g.ActiveId != id)
        return false;

    switch (data_type)
    {
    case ImGuiDataType_S8:     { ImS32 v32 = (ImS32)*(ImS8*)v;  bool r = DragBehaviorT<ImS32, ImS32, float >(ImGuiDataType_S32, &v32, v_speed, v_min ? *(const ImS8*) v_min : IM_S8_MIN,  v_max ? *(const ImS8*)v_max  : IM_S8_MAX,  format, power, flags); if (r) *(ImS8*)v = (ImS8)v32; return r; }
    case ImGuiDataType_U8:     { ImU32 v32 = (ImU32)*(ImU8*)v;  bool r = DragBehaviorT<ImU32, ImS32, float >(ImGuiDataType_U32, &v32, v_speed, v_min ? *(const ImU8*) v_min : IM_U8_MIN,  v_max ? *(const ImU8*)v_max  : IM_U8_MAX,  format, power, flags); if (r) *(ImU8*)v = (ImU8)v32; return r; }
    case ImGuiDataType_S16:    { ImS32 v32 = (ImS32)*(ImS16*)v; bool r = DragBehaviorT<ImS32, ImS32, float >(ImGuiDataType_S32, &v32, v_speed, v_min ? *(const ImS16*)v_min : IM_S16_MIN, v_max ? *(const ImS16*)v_max : IM_S16_MAX, format, power, flags); if (r) *(ImS16*)v = (ImS16)v32; return r; }
    case ImGuiDataType_U16:    { ImU32 v32 = (ImU32)*(ImU16*)v; bool r = DragBehaviorT<ImU32, ImS32, float >(ImGuiDataType_U32, &v32, v_speed, v_min ? *(const ImU16*)v_min : IM_U16_MIN, v_max ? *(const ImU16*)v_max : IM_U16_MAX, format, power, flags); if (r) *(ImU16*)v = (ImU16)v32; return r; }
    case ImGuiDataType_S32:    return DragBehaviorT<ImS32, ImS32, float >(data_type, (ImS32*)v,  v_speed, v_min ? *(const ImS32* )v_min : IM_S32_MIN, v_max ? *(const ImS32* )v_max : IM_S32_MAX, format, power, flags);
    case ImGuiDataType_U32:    return DragBehaviorT<ImU32, ImS32, float >(data_type, (ImU32*)v,  v_speed, v_min ? *(const ImU32* )v_min : IM_U32_MIN, v_max ? *(const ImU32* )v_max : IM_U32_MAX, format, power, flags);
    case ImGuiDataType_S64:    return DragBehaviorT<ImS64, ImS64, double>(data_type, (ImS64*)v,  v_speed, v_min ? *(const ImS64* )v_min : IM_S64_MIN, v_max ? *(const ImS64* )v_max : IM_S64_MAX, format, power, flags);
    case ImGuiDataType_U64:    return DragBehaviorT<ImU64, ImS64, double>(data_type, (ImU64*)v,  v_speed, v_min ? *(const ImU64* )v_min : IM_U64_MIN, v_max ? *(const ImU64* )v_max : IM_U64_MAX, format, power, flags);
    case ImGuiDataType_Float:  return DragBehaviorT<float, float, float >(data_type, (float*)v,  v_speed, v_min ? *(const float* )v_min : -FLT_MAX,   v_max ? *(const float* )v_max : FLT_MAX,    format, power, flags);
    case ImGuiDataType_Double: return DragBehaviorT<double,double,double>(data_type, (double*)v, v_speed, v_min ? *(const double*)v_min : -DBL_MAX,   v_max ? *(const double*)v_max : DBL_MAX,    format, power, flags);
    case ImGuiDataType_COUNT:  break;
    }
    IM_ASSERT(0);
    return false;
}